

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

optional<(anonymous_namespace)::cmSourceInfo> *
anon_unknown.dwarf_b8f60f::cmcmd_cmake_ninja_depends_fortran
          (optional<(anonymous_namespace)::cmSourceInfo> *__return_storage_ptr__,string *arg_tdi,
          string *arg_src,string *arg_src_orig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Value *pVVar6;
  _Base_ptr p_Var7;
  const_iterator cVar8;
  _Elt_pointer pEVar9;
  _Rb_tree_node_base *p_Var10;
  string *this;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  const_iterator cVar11;
  Value tdio;
  string mod;
  string dir_top_bld;
  string module_dir;
  cmSourceReqInfo src_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  cmFortranCompiler fc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmFortranSourceInfo finfo;
  cmFortranParser parser;
  ValueHolder local_5b8;
  pointer pcStack_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  undefined8 local_598;
  undefined8 local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  pointer local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_558;
  undefined1 local_550 [24];
  undefined8 local_538;
  _Alloc_hider local_530;
  undefined1 local_528 [16];
  undefined1 local_518 [8];
  char *pcStack_510;
  undefined1 local_508 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  undefined1 local_4e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  pointer local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_4b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  undefined1 *local_480;
  long local_478;
  undefined1 local_470;
  undefined7 uStack_46f;
  undefined1 *local_460;
  long local_458;
  undefined1 local_450;
  undefined7 uStack_44f;
  undefined1 *local_440;
  long local_438;
  undefined1 local_430;
  undefined7 uStack_42f;
  undefined1 local_420 [32];
  _Base_ptr local_400;
  size_t local_3f8;
  undefined1 local_3f0 [32];
  _Alloc_hider local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  undefined1 local_378 [8];
  size_t local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  undefined1 local_328 [16];
  _Elt_pointer local_318;
  _Elt_pointer local_310;
  _Elt_pointer local_308;
  _Map_pointer local_300;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  undefined1 local_2c8 [16];
  _Base_ptr local_2b8;
  _Rb_tree_node_base *local_2b0;
  _Rb_tree_node_base *local_2a8;
  Location local_2a0;
  _Alloc_hider local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  cmFortranParser_s local_238;
  
  (__return_storage_ptr__->super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
  _M_payload.super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_engaged = false;
  local_480 = &local_470;
  local_478 = 0;
  local_470 = 0;
  local_460 = &local_450;
  local_458 = 0;
  local_450 = 0;
  local_440 = &local_430;
  local_438 = 0;
  local_430 = 0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_560 = (pointer)local_550;
  local_558 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_550[0] = 0;
  local_538 = local_528;
  local_530._M_p = (pointer)0x0;
  local_528[0] = 0;
  local_550._16_8_ = arg_src;
  if (arg_src_orig->_M_string_length != 0) {
    cmsys::SystemTools::GetParentDirectory((string *)&local_238,arg_src_orig);
    if ((pointer)local_238.Compiler.Id._M_string_length != (pointer)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_498,(value_type *)&local_238);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != &local_238.Compiler.Id.field_2) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value((Value *)&local_5b8,nullValue);
  std::ifstream::ifstream(&local_238,(arg_tdi->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)local_378);
  bVar3 = Json::Reader::parse((Reader *)local_378,(istream *)&local_238,(Value *)&local_5b8,false);
  if (!bVar3) {
    Json::Reader::getFormattedErrorMessages_abi_cxx11_((String *)&local_580,(Reader *)local_378);
    local_518 = (undefined1  [8])0x27;
    pcStack_510 = "-E cmake_ninja_depends failed to parse ";
    local_508._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_4f8._M_allocated_capacity = (size_type)(arg_tdi->_M_dataplus)._M_p;
    local_508._8_8_ = arg_tdi->_M_string_length;
    local_4f8._8_8_ = (pointer)0x0;
    local_4e8._0_8_ = local_580._8_8_;
    local_4e8._8_8_ = local_580._M_allocated_capacity;
    views._M_len = 3;
    views._M_array = (iterator)local_518;
    local_4d8._M_allocated_capacity = (size_type)&local_580;
    cmCatViews((string *)local_420,views);
    cmSystemTools::Error((string *)local_420);
    if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
      operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_allocated_capacity != &local_570) {
      operator_delete((void *)local_580._M_allocated_capacity,local_570._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &local_280) {
    operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
  }
  if (local_2f8._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)local_2c8) {
    operator_delete(local_2f8._M_impl.super__Rb_tree_header._M_header._M_right,local_2c8._0_8_ + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)local_328);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_378);
  std::ifstream::~ifstream(&local_238);
  if (bVar3) {
    pVVar6 = Json::Value::operator[]((Value *)&local_5b8,"dir-top-bld");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar6);
    std::__cxx11::string::operator=((string *)&local_560,(string *)&local_238);
    paVar1 = &local_238.Compiler.Id.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    if (local_558 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_238.Compiler.Id._M_dataplus._M_p = (pointer)local_558;
      local_238.Compiler.Id._M_string_length = (size_type)local_560;
      __str._M_str = "/";
      __str._M_len = 1;
      iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,
                         (size_type)(local_558->_M_local_buf + -1),1,__str);
      if (iVar5 != 0) {
        std::__cxx11::string::push_back((char)&local_560);
      }
    }
    pVVar6 = Json::Value::operator[]((Value *)&local_5b8,"include-dirs");
    bVar4 = Json::Value::isArray(pVVar6);
    if (bVar4) {
      cVar11 = Json::Value::begin(pVVar6);
      local_378 = (undefined1  [8])cVar11.super_ValueIteratorBase.current_._M_node;
      local_370 = CONCAT71(local_370._1_7_,cVar11.super_ValueIteratorBase.isNull_);
      cVar11 = Json::Value::end(pVVar6);
      local_518 = (undefined1  [8])cVar11.super_ValueIteratorBase.current_._M_node;
      pcStack_510 = (char *)CONCAT71(pcStack_510._1_7_,cVar11.super_ValueIteratorBase.isNull_);
      while (bVar4 = Json::ValueIteratorBase::isEqual
                               ((ValueIteratorBase *)local_378,(SelfType *)local_518), !bVar4) {
        pVVar6 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_378);
        Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
          operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                          local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
        }
        Json::ValueIteratorBase::increment((ValueIteratorBase *)local_378);
      }
    }
    pVVar6 = Json::Value::operator[]((Value *)&local_5b8,"module-dir");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar6);
    std::__cxx11::string::operator=((string *)&local_538,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_238.Compiler.Id._M_dataplus._M_p = local_530._M_p;
      local_238.Compiler.Id._M_string_length = local_538;
      __str_00._M_str = "/";
      __str_00._M_len = 1;
      iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,
                         (size_type)(local_530._M_p + -1),1,__str_00);
      if (iVar5 != 0) {
        std::__cxx11::string::push_back((char)&local_538);
      }
    }
    pVVar6 = Json::Value::operator[]((Value *)&local_5b8,"compiler-id");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar6);
    std::__cxx11::string::operator=((string *)&local_480,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    pVVar6 = Json::Value::operator[]((Value *)&local_5b8,"submodule-sep");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar6);
    std::__cxx11::string::operator=((string *)&local_460,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    pVVar6 = Json::Value::operator[]((Value *)&local_5b8,"submodule-ext");
    Json::Value::asString_abi_cxx11_((String *)&local_238,pVVar6);
    std::__cxx11::string::operator=((string *)&local_440,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.Compiler.Id._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                      local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value((Value *)&local_5b8);
    if (bVar3) {
      local_378 = (undefined1  [8])&local_368;
      local_370 = 0;
      local_368._M_local_buf[0] = '\0';
      local_358._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_358._M_impl.super__Rb_tree_header._M_header;
      local_358._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_358._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_358._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_310 = (_Elt_pointer)(local_328 + 8);
      local_328._8_4_ = _S_red;
      local_318 = (_Elt_pointer)0x0;
      local_300 = (_Map_pointer)0x0;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_2f8._M_impl.super__Rb_tree_header._M_header;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2b0 = (_Rb_tree_node_base *)(local_2c8 + 8);
      local_2c8._8_4_ = 0;
      local_2b8 = (_Base_ptr)0x0;
      local_2a0 = (Location)0x0;
      local_420._24_8_ = local_420 + 8;
      local_420._8_4_ = _S_red;
      local_420._16_8_ = 0;
      local_3f8 = 0;
      local_400 = (_Base_ptr)local_420._24_8_;
      local_3f0._0_8_ = local_3f0 + 0x10;
      local_358._M_impl.super__Rb_tree_header._M_header._M_right =
           local_358._M_impl.super__Rb_tree_header._M_header._M_left;
      local_308 = local_310;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_2a8 = local_2b0;
      std::__cxx11::string::_M_construct<char*>((string *)local_3f0,local_480,local_480 + local_478)
      ;
      local_3d0._M_p = (pointer)&local_3c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d0,local_460,local_460 + local_458);
      local_3b0._M_p = (pointer)&local_3a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,local_440,local_440 + local_438);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_390,&local_498);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&local_268,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_420);
      cmFortranParser_s::cmFortranParser_s
                (&local_238,(cmFortranCompiler *)local_3f0,&local_390,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_268,(cmFortranSourceInfo *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_268);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_p != &local_3a0) {
        operator_delete(local_3b0._M_p,local_3a0._M_allocated_capacity + 1);
      }
      uVar2 = local_550._16_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_p != &local_3c0) {
        operator_delete(local_3d0._M_p,local_3c0._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
        operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
      }
      bVar3 = cmFortranParser_FilePush(&local_238,*(char **)uVar2);
      if (bVar3) {
        iVar5 = cmFortran_yyparse(local_238.Scanner);
        if (iVar5 == 0) {
          local_508._8_8_ = (_Base_ptr)0x0;
          vStack_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4b8 = (pointer)0x0;
          vStack_4b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_4c8._M_allocated_capacity = 0;
          local_4c8._8_8_ = (pointer)0x0;
          local_4d8._M_allocated_capacity = 0;
          local_4d8._8_8_ = (pointer)0x0;
          local_4e8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_4e8._8_8_ = (pointer)0x0;
          local_4f8._M_allocated_capacity = 0;
          local_4f8._8_8_ = (pointer)0x0;
          local_518 = (undefined1  [8])local_508;
          pcStack_510 = (char *)0x0;
          local_508._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          if ((__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_engaged == true)
          {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_518);
            local_5b8 = *(ValueHolder *)
                         &(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.ExtraOutputs;
            pcStack_5b0 = *(pointer *)
                           ((long)&(__return_storage_ptr__->
                                   super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>
                                   )._M_payload.
                                   super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>
                                   ._M_payload._M_value.ScanDep.ExtraOutputs + 8);
            local_5a8._M_allocated_capacity =
                 (size_type)
                 *(pointer *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.ExtraOutputs + 0x10);
            *(size_type *)
             &(__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload._M_value.
              ScanDep.ExtraOutputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl = local_4f8._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.ExtraOutputs + 8) = local_4f8._8_8_;
            ((ValueHolder *)
            ((long)&(__return_storage_ptr__->
                    super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                    _M_payload.
                    super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                    .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                    _M_value.ScanDep.ExtraOutputs + 0x10))->int_ = local_4e8._0_8_;
            local_4f8._M_allocated_capacity = 0;
            local_4f8._8_8_ = (pointer)0x0;
            local_4e8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_5b8);
            local_5b8 = *(ValueHolder *)
                         &(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.Provides;
            pcStack_5b0 = *(pointer *)
                           ((long)&(__return_storage_ptr__->
                                   super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>
                                   )._M_payload.
                                   super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>
                                   ._M_payload._M_value.ScanDep.Provides + 8);
            local_5a8._M_allocated_capacity =
                 (size_type)
                 *(pointer *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.Provides + 0x10);
            *(undefined8 *)
             &(__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload._M_value.
              ScanDep.Provides.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>
              ._M_impl = local_4e8._8_8_;
            *(size_type *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.Provides + 8) = local_4d8._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.Provides + 0x10) = local_4d8._8_8_;
            local_4e8._8_8_ = (pointer)0x0;
            local_4d8._M_allocated_capacity = 0;
            local_4d8._8_8_ = (pointer)0x0;
            std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                      ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)&local_5b8);
            local_5b8 = *(ValueHolder *)
                         &(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.Requires;
            pcStack_5b0 = *(pointer *)
                           ((long)&(__return_storage_ptr__->
                                   super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>
                                   )._M_payload.
                                   super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>
                                   ._M_payload._M_value.ScanDep.Requires + 8);
            local_5a8._M_allocated_capacity =
                 (size_type)
                 *(pointer *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.ScanDep.Requires + 0x10);
            *(size_type *)
             &(__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload._M_value.
              ScanDep.Requires.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>
              ._M_impl = local_4c8._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.Requires + 8) = local_4c8._8_8_;
            *(pointer *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.ScanDep.Requires + 0x10) = local_4b8;
            local_4c8._M_allocated_capacity = 0;
            local_4c8._8_8_ = (pointer)0x0;
            local_4b8 = (pointer)0x0;
            std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                      ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)&local_5b8);
            local_5b8 = *(ValueHolder *)
                         &(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.Includes.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ;
            pcStack_5b0 = *(pointer *)
                           ((long)&(__return_storage_ptr__->
                                   super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>
                                   )._M_payload.
                                   super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>
                                   ._M_payload._M_value.Includes.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           + 8);
            local_5a8._M_allocated_capacity =
                 (size_type)
                 *(pointer *)
                  ((long)&(__return_storage_ptr__->
                          super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                          .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                          _M_payload._M_value.Includes.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 0x10);
            *(pointer *)
             &(__return_storage_ptr__->
              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)._M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload._M_value.
              Includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl = vStack_4b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            *(pointer *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.Includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             + 8) = vStack_4b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
            *(pointer *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                     .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                     _M_value.Includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             + 0x10) = vStack_4b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            vStack_4b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_4b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_4b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_5b8);
          }
          else {
            std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::
            _M_construct<(anonymous_namespace)::cmSourceInfo>
                      ((_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)
                       __return_storage_ptr__,(cmSourceInfo *)local_518);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&vStack_4b0);
          std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                    ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)&local_4c8);
          std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector
                    ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)(local_4e8 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_4f8);
          if (local_518 != (undefined1  [8])local_508) {
            operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
          }
          if ((_Rb_tree_header *)local_358._M_impl.super__Rb_tree_header._M_header._M_left !=
              &local_358._M_impl.super__Rb_tree_header) {
            this = (string *)
                   &(__return_storage_ptr__->
                    super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                    _M_payload.
                    super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                    .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                    _M_value.ScanDep.Provides;
            p_Var7 = local_358._M_impl.super__Rb_tree_header._M_header._M_left;
            local_550._16_8_ = this;
            do {
              local_518 = (undefined1  [8])local_508;
              pcStack_510 = (char *)0x0;
              local_508._0_8_ = local_508._0_8_ & 0xffffffffffffff00;
              local_4f8._8_8_ = (pointer)0x0;
              local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffffffffff00;
              local_4d8._8_8_ = (pointer)0x0;
              local_4c8._M_allocated_capacity = local_4c8._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_4b8 = (pointer)CONCAT62(local_4b8._2_6_,0x100);
              local_4b8 = (pointer)((ulong)local_4b8 & 0xffffffff);
              local_4f8._M_allocated_capacity = (size_type)local_4e8;
              local_4d8._M_allocated_capacity = (size_type)&local_4c8;
              std::__cxx11::string::_M_assign((string *)local_518);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_530._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                local_5b8.int_ = (LargestInt)local_530._M_p;
                pcStack_5b0 = (pointer)local_538;
                local_5a8._M_allocated_capacity = 0;
                local_598 = *(undefined8 *)(p_Var7 + 1);
                local_5a8._8_8_ = p_Var7[1]._M_parent;
                local_590 = 0;
                views_01._M_len = 2;
                views_01._M_array = (iterator)&local_5b8;
                cmCatViews((string *)&local_580,views_01);
                if (local_558 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  local_5b8 = (ValueHolder)local_580._8_8_;
                  pcStack_5b0 = (pointer)local_580._M_allocated_capacity;
                  __str_01._M_str = (char *)local_560;
                  __str_01._M_len = (size_t)local_558;
                  iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_5b8,
                                     0,(size_type)local_558,__str_01);
                  if (iVar5 == 0) {
                    std::__cxx11::string::substr((ulong)&local_5b8,(ulong)&local_580);
                    std::__cxx11::string::operator=
                              ((string *)local_580._M_local_buf,(string *)&local_5b8.bool_);
                    this = (string *)local_550._16_8_;
                    if (local_5b8 != &local_5a8) {
                      operator_delete(local_5b8.string_,(ulong)(local_5a8._M_allocated_capacity + 1)
                                     );
                      this = (string *)local_550._16_8_;
                    }
                  }
                }
                std::__cxx11::string::operator=
                          ((string *)local_4d8._M_local_buf,(string *)local_580._M_local_buf);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_580._M_allocated_capacity != &local_570) {
                  operator_delete((void *)local_580._M_allocated_capacity,
                                  local_570._M_allocated_capacity + 1);
                }
              }
              std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
              emplace_back<cmSourceReqInfo&>
                        ((vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *)this,
                         (cmSourceReqInfo *)local_518);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_allocated_capacity != &local_4c8) {
                operator_delete((void *)local_4d8._M_allocated_capacity,
                                (ulong)(local_4c8._M_allocated_capacity + 1));
              }
              if ((undefined1 *)local_4f8._M_allocated_capacity != local_4e8) {
                operator_delete((void *)local_4f8._M_allocated_capacity,local_4e8._0_8_ + 1);
              }
              if (local_518 != (undefined1  [8])local_508) {
                operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
              }
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
            } while ((_Rb_tree_header *)p_Var7 != &local_358._M_impl.super__Rb_tree_header);
          }
          if (local_310 != (_Elt_pointer)(local_328 + 8)) {
            pEVar9 = local_310;
            do {
              cVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_358,(key_type *)&(pEVar9->message_)._M_string_length);
              if ((_Rb_tree_header *)cVar8._M_node == &local_358._M_impl.super__Rb_tree_header) {
                local_518 = (undefined1  [8])local_508;
                pcStack_510 = (char *)0x0;
                local_508._0_8_ = local_508._0_8_ & 0xffffffffffffff00;
                local_4f8._M_allocated_capacity = (size_type)local_4e8;
                local_4f8._8_8_ = (pointer)0x0;
                local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffffffffff00;
                local_4d8._8_8_ = (pointer)0x0;
                local_4c8._M_allocated_capacity =
                     local_4c8._M_allocated_capacity & 0xffffffffffffff00;
                local_4b8 = (pointer)CONCAT62(local_4b8._2_6_,0x100);
                local_4b8 = (pointer)((ulong)local_4b8 & 0xffffffff);
                local_4d8._M_allocated_capacity = (size_type)&local_4c8;
                std::__cxx11::string::_M_assign((string *)local_518);
                std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
                emplace_back<cmSourceReqInfo&>
                          ((vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *)
                           &(__return_storage_ptr__->
                            super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>)
                            ._M_payload.
                            super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                            .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                            _M_payload._M_value.ScanDep.Requires,(cmSourceReqInfo *)local_518);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_allocated_capacity != &local_4c8) {
                  operator_delete((void *)local_4d8._M_allocated_capacity,
                                  (ulong)(local_4c8._M_allocated_capacity + 1));
                }
                if ((undefined1 *)local_4f8._M_allocated_capacity != local_4e8) {
                  operator_delete((void *)local_4f8._M_allocated_capacity,local_4e8._0_8_ + 1);
                }
                if (local_518 != (undefined1  [8])local_508) {
                  operator_delete((void *)local_518,(ulong)(local_508._0_8_ + 1));
                }
              }
              pEVar9 = (_Elt_pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)pEVar9);
            } while (pEVar9 != (_Elt_pointer)(local_328 + 8));
          }
          if (local_2b0 != (_Rb_tree_node_base *)(local_2c8 + 8)) {
            p_Var10 = local_2b0;
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&(__return_storage_ptr__->
                           super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>).
                           _M_payload.
                           super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                           .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                           _M_payload._M_value.Includes,(value_type *)(p_Var10 + 1));
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
            } while (p_Var10 != (_Rb_tree_node_base *)(local_2c8 + 8));
          }
        }
      }
      else {
        local_518 = (undefined1  [8])0x26;
        pcStack_510 = "-E cmake_ninja_depends failed to open ";
        local_508._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_4f8._M_allocated_capacity = *(undefined8 *)uVar2;
        local_508._8_8_ = *(size_type *)(uVar2 + 8);
        local_4f8._8_8_ = (pointer)0x0;
        views_00._M_len = 2;
        views_00._M_array = (iterator)local_518;
        cmCatViews((string *)&local_5b8,views_00);
        cmSystemTools::Error((string *)&local_5b8);
        if (local_5b8 != &local_5a8) {
          operator_delete(local_5b8.string_,(ulong)(local_5a8._M_allocated_capacity + 1));
        }
      }
      cmFortranParser_s::~cmFortranParser_s(&local_238);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_420);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_2f8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_358);
      if (local_378 != (undefined1  [8])&local_368) {
        operator_delete((void *)local_378,
                        CONCAT71(local_368._M_allocated_capacity._1_7_,local_368._M_local_buf[0]) +
                        1);
      }
      if ((pointer)local_538 != (pointer)local_528) {
        operator_delete((void *)local_538,CONCAT71(local_528._1_7_,local_528[0]) + 1);
      }
      if (local_560 != (pointer)local_550) {
        operator_delete(local_560,CONCAT71(local_550._1_7_,local_550[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_498);
      if (local_440 != &local_430) {
        operator_delete(local_440,CONCAT71(uStack_42f,local_430) + 1);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,CONCAT71(uStack_44f,local_450) + 1);
      }
      if (local_480 == &local_470) {
        return __return_storage_ptr__;
      }
      operator_delete(local_480,CONCAT71(uStack_46f,local_470) + 1);
      return __return_storage_ptr__;
    }
  }
  else {
    Json::Value::~Value((Value *)&local_5b8);
  }
  if ((pointer)local_538 != (pointer)local_528) {
    operator_delete((void *)local_538,CONCAT71(local_528._1_7_,local_528[0]) + 1);
  }
  if (local_560 != (pointer)local_550) {
    operator_delete(local_560,CONCAT71(local_550._1_7_,local_550[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_498);
  if (local_440 != &local_430) {
    operator_delete(local_440,CONCAT71(uStack_42f,local_430) + 1);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,CONCAT71(uStack_44f,local_450) + 1);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480,CONCAT71(uStack_46f,local_470) + 1);
  }
  if (bVar3) {
    std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::_M_reset
              ((_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)__return_storage_ptr__
              );
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmSourceInfo> cmcmd_cmake_ninja_depends_fortran(
  std::string const& arg_tdi, std::string const& arg_src,
  std::string const& arg_src_orig)
{
  cm::optional<cmSourceInfo> info;
  cmFortranCompiler fc;
  std::vector<std::string> includes;
  std::string dir_top_bld;
  std::string module_dir;

  if (!arg_src_orig.empty()) {
    // Prepend the original source file's directory as an include directory
    // so Fortran INCLUDE statements can look for files in it.
    std::string src_orig_dir = cmSystemTools::GetParentDirectory(arg_src_orig);
    if (!src_orig_dir.empty()) {
      includes.push_back(src_orig_dir);
    }
  }

  {
    Json::Value tdio;
    Json::Value const& tdi = tdio;
    {
      cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
      Json::Reader reader;
      if (!reader.parse(tdif, tdio, false)) {
        cmSystemTools::Error(
          cmStrCat("-E cmake_ninja_depends failed to parse ", arg_tdi,
                   reader.getFormattedErrorMessages()));
        return info;
      }
    }

    dir_top_bld = tdi["dir-top-bld"].asString();
    if (!dir_top_bld.empty() && !cmHasLiteralSuffix(dir_top_bld, "/")) {
      dir_top_bld += '/';
    }

    Json::Value const& tdi_include_dirs = tdi["include-dirs"];
    if (tdi_include_dirs.isArray()) {
      for (auto const& tdi_include_dir : tdi_include_dirs) {
        includes.push_back(tdi_include_dir.asString());
      }
    }

    Json::Value const& tdi_module_dir = tdi["module-dir"];
    module_dir = tdi_module_dir.asString();
    if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
      module_dir += '/';
    }

    Json::Value const& tdi_compiler_id = tdi["compiler-id"];
    fc.Id = tdi_compiler_id.asString();

    Json::Value const& tdi_submodule_sep = tdi["submodule-sep"];
    fc.SModSep = tdi_submodule_sep.asString();

    Json::Value const& tdi_submodule_ext = tdi["submodule-ext"];
    fc.SModExt = tdi_submodule_ext.asString();
  }

  cmFortranSourceInfo finfo;
  std::set<std::string> defines;
  cmFortranParser parser(fc, includes, defines, finfo);
  if (!cmFortranParser_FilePush(&parser, arg_src.c_str())) {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_depends failed to open ", arg_src));
    return info;
  }
  if (cmFortran_yyparse(parser.Scanner) != 0) {
    // Failed to parse the file.
    return info;
  }

  info = cmSourceInfo();
  for (std::string const& provide : finfo.Provides) {
    cmSourceReqInfo src_info;
    src_info.LogicalName = provide;
    if (!module_dir.empty()) {
      std::string mod = cmStrCat(module_dir, provide);
      if (!dir_top_bld.empty() && cmHasPrefix(mod, dir_top_bld)) {
        mod = mod.substr(dir_top_bld.size());
      }
      src_info.CompiledModulePath = std::move(mod);
    }
    info->ScanDep.Provides.emplace_back(src_info);
  }
  for (std::string const& require : finfo.Requires) {
    // Require modules not provided in the same source.
    if (finfo.Provides.count(require)) {
      continue;
    }
    cmSourceReqInfo src_info;
    src_info.LogicalName = require;
    info->ScanDep.Requires.emplace_back(src_info);
  }
  for (std::string const& include : finfo.Includes) {
    info->Includes.push_back(include);
  }
  return info;
}